

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

int gdImageColorAllocateAlpha(gdImagePtr im,int r,int g,int b,int a)

{
  int local_30;
  int local_2c;
  int ct;
  int i;
  int a_local;
  int b_local;
  int g_local;
  int r_local;
  gdImagePtr im_local;
  
  local_30 = -1;
  if (im->trueColor == 0) {
    for (local_2c = 0; local_2c < im->colorsTotal; local_2c = local_2c + 1) {
      if (im->open[local_2c] != 0) {
        local_30 = local_2c;
        break;
      }
    }
    if (local_30 == -1) {
      local_30 = im->colorsTotal;
      if (local_30 == 0x100) {
        return -1;
      }
      im->colorsTotal = im->colorsTotal + 1;
    }
    im->red[local_30] = r;
    im->green[local_30] = g;
    im->blue[local_30] = b;
    im->alpha[local_30] = a;
    im->open[local_30] = 0;
    im_local._4_4_ = local_30;
  }
  else {
    im_local._4_4_ = a * 0x1000000 + r * 0x10000 + g * 0x100 + b;
  }
  return im_local._4_4_;
}

Assistant:

BGD_DECLARE(int) gdImageColorAllocateAlpha (gdImagePtr im, int r, int g, int b, int a)
{
	int i;
	int ct = (-1);
	if (im->trueColor) {
		return gdTrueColorAlpha (r, g, b, a);
	}
	for (i = 0; (i < (im->colorsTotal)); i++) {
		if (im->open[i]) {
			ct = i;
			break;
		}
	}
	if (ct == (-1)) {
		ct = im->colorsTotal;
		if (ct == gdMaxColors) {
			return -1;
		}
		im->colorsTotal++;
	}
	im->red[ct] = r;
	im->green[ct] = g;
	im->blue[ct] = b;
	im->alpha[ct] = a;
	im->open[ct] = 0;
	return ct;
}